

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mars.cpp
# Opt level: O2

void __thiscall MARS::f_trans(MARS *this,uint *a,uint *b,uint *c,uint *d,uint i)

{
  uint local_34;
  uint local_30;
  uint local_2c;
  
  e_func((MARS *)&stack0xffffffffffffffcc,(uint *)this,a,(this->K)._M_elems + (i * 2 + 4));
  *a = *a << 0xd | *a >> 0x13;
  *c = *c + local_30;
  *b = *b + local_2c;
  *d = *d ^ local_34;
  return;
}

Assistant:

void MARS::f_trans(unsigned &a, unsigned &b, unsigned &c, unsigned &d, unsigned i) {
    auto[out1, out2, out3] = e_func(a, K[2 * i + 4], K[2 * i + 5]);
    a = rotl(a, 13);
    c += out2;
    b += out1;
    d = d ^ out3;
}